

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_locale.cpp
# Opt level: O2

ON_Locale * ON_Locale::FromAppleName(ON_Locale *__return_storage_ptr__,char *apple_name)

{
  bool bVar1;
  char *pcVar2;
  ON__UINT32 windows_lcid;
  char *name;
  ON_String buffer;
  
  ON_String::ON_String(&buffer,apple_name);
  ON_String::Replace(&buffer,'_','-');
  pcVar2 = ON_String::operator_cast_to_char_(&buffer);
  bVar1 = ON_String::EqualOrdinal("zh-Hans",-1,pcVar2,-1,true);
  windows_lcid = 0x804;
  if (bVar1) {
    name = "zh-CN";
  }
  else {
    name = "zh-CN";
    bVar1 = ON_String::EqualOrdinal("zh-CN",-1,pcVar2,-1,true);
    if (!bVar1) {
      bVar1 = ON_String::EqualOrdinal("zh-Hant",-1,pcVar2,-1,true);
      windows_lcid = 0x404;
      if (bVar1) {
        name = "zh-TW";
      }
      else {
        name = "zh-TW";
        bVar1 = ON_String::EqualOrdinal("zh-TW",-1,pcVar2,-1,true);
        if (!bVar1) {
          pcVar2 = ON_String::operator_cast_to_char_(&buffer);
          FromWindowsName(__return_storage_ptr__,pcVar2);
          goto LAB_004e8ab7;
        }
      }
    }
  }
  FromWindowsLCIDAndName(__return_storage_ptr__,windows_lcid,name);
LAB_004e8ab7:
  ON_String::~ON_String(&buffer);
  return __return_storage_ptr__;
}

Assistant:

ON_Locale ON_Locale::FromAppleName(
  const char* apple_name
  )
{
  // Apple "locale" names have underbars before <REGION>
  // Apple "language" names have hyphens before <REGION> or no <REGION> in the case of Chinese

  ON_String buffer(apple_name);
  buffer.Replace('_', '-'); 
  apple_name = buffer;

  // According to https://en.wikipedia.org/wiki/Chinese_language, Chinese is a family of language
  // varieties, often mutually unintelligible.  Specifying both Script and REGION
  // (zh-Hans-CN or zh-Hant-TW) doesn't narrow things down nearly enough. 
  //
  // Basically we have to hope the string collate and mapping functions supplied by the OS and 
  // the translations supplied by our staff work well for our customers who select from the 
  // two types of "Chinese" Rhino offers.
  //
  if (ON_String::EqualOrdinal("zh-Hans", -1, apple_name, -1, true) || ON_String::EqualOrdinal("zh-CN", -1, apple_name, -1, true))
  {
    // Apple uses "zh-Hanx" for the "language" name and "zh_CN" for the "locale" name 
    // when identifying OS X string services that might be useful to people who live
    // in the Peoples Republic of China.
    return ON_Locale::FromWindowsLCIDAndName(ON_Locale::WindowsLCID::zh_CN_LCID, "zh-CN");
  }
  
  if (ON_String::EqualOrdinal("zh-Hant", -1, apple_name, -1, true) || ON_String::EqualOrdinal("zh-TW", -1, apple_name, -1, true))
  {
    // Apple uses "zh-Hant" for the "language" name and "zh_TW" for the "locale" name 
    // when identifying OS X string services that might be useful to people who live
    // in Taiwan.
    return ON_Locale::FromWindowsLCIDAndName(ON_Locale::WindowsLCID::zh_TW_LCID, "zh-TW");
  }

  return ON_Locale::FromWindowsName( static_cast<const char*>(buffer) );
}